

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaRead.c
# Opt level: O3

void Pla_ReadAddBody(Pla_Man_t *p,Vec_Str_t *vLits)

{
  uint uVar1;
  int iVar2;
  word *pwVar3;
  word *pwVar4;
  undefined1 auVar5 [16];
  uint uVar6;
  uint uVar7;
  int *piVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  word extraout_RDX;
  word extraout_RDX_00;
  word extraout_RDX_01;
  word Fill;
  word Fill_00;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  int iVar15;
  byte bVar16;
  ulong uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  
  iVar9 = p->nOuts + p->nIns;
  uVar12 = (long)vLits->nSize / (long)iVar9;
  if (vLits->nSize % iVar9 != 0) {
    __assert_fail("Vec_StrSize(vLits) % (p->nIns + p->nOuts) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/pla/plaRead.c"
                  ,0xa2,"void Pla_ReadAddBody(Pla_Man_t *, Vec_Str_t *)");
  }
  uVar7 = (uint)uVar12;
  uVar13 = (p->vCubes).nSize;
  if (uVar7 != uVar13) {
    printf("Warning: Declared number of cubes (%d) differs from the actual (%d).\n",(ulong)uVar13,
           uVar12 & 0xffffffff);
    iVar9 = (p->vCubes).nSize;
    if ((int)uVar7 < iVar9) {
      (p->vCubes).nSize = uVar7;
    }
    else {
      if ((int)uVar7 <= iVar9) {
        __assert_fail("nCubesReal > Pla_ManCubeNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/pla/plaRead.c"
                      ,0xab,"void Pla_ReadAddBody(Pla_Man_t *, Vec_Str_t *)");
      }
      Fill = extraout_RDX;
      if ((p->vCubes).nCap < (int)uVar7) {
        piVar8 = (p->vCubes).pArray;
        if (piVar8 == (int *)0x0) {
          piVar8 = (int *)malloc((long)(int)uVar7 << 2);
          Fill = extraout_RDX_01;
        }
        else {
          piVar8 = (int *)realloc(piVar8,(long)(int)uVar7 << 2);
          Fill = extraout_RDX_00;
        }
        (p->vCubes).pArray = piVar8;
        if (piVar8 == (int *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        (p->vCubes).nCap = uVar7;
      }
      auVar5 = _DAT_0093d220;
      if (0 < (int)uVar7) {
        piVar8 = (p->vCubes).pArray;
        lVar14 = (uVar12 & 0xffffffff) - 1;
        auVar18._8_4_ = (int)lVar14;
        auVar18._0_8_ = lVar14;
        auVar18._12_4_ = (int)((ulong)lVar14 >> 0x20);
        Fill = 0;
        auVar18 = auVar18 ^ _DAT_0093d220;
        auVar19 = _DAT_0093d210;
        do {
          auVar20 = auVar19 ^ auVar5;
          if ((bool)(~(auVar20._4_4_ == auVar18._4_4_ && auVar18._0_4_ < auVar20._0_4_ ||
                      auVar18._4_4_ < auVar20._4_4_) & 1)) {
            piVar8[Fill] = (int)Fill;
          }
          if ((auVar20._12_4_ != auVar18._12_4_ || auVar20._8_4_ <= auVar18._8_4_) &&
              auVar20._12_4_ <= auVar18._12_4_) {
            piVar8[Fill + 1] = (int)Fill + 1;
          }
          Fill = Fill + 2;
          lVar14 = auVar19._8_8_;
          auVar19._0_8_ = auVar19._0_8_ + 2;
          auVar19._8_8_ = lVar14 + 2;
        } while ((uVar7 + 1 & 0xfffffffe) != Fill);
      }
      (p->vCubes).nSize = uVar7;
      Vec_WrdFillExtra(&p->vInBits,p->nInWords * uVar7,Fill);
      Vec_WrdFillExtra(&p->vOutBits,p->nOutWords * uVar7,Fill_00);
      uVar7 = (p->vCubes).nSize;
    }
  }
  if ((int)uVar7 < 1) {
    uVar13 = 0;
  }
  else {
    iVar9 = p->nInWords;
    uVar12 = 0;
    uVar13 = 0;
    do {
      lVar14 = uVar12 * (long)iVar9;
      if ((((lVar14 < 0) || ((p->vInBits).nSize <= lVar14)) ||
          (uVar10 = p->nOutWords * (int)uVar12, (int)uVar10 < 0)) ||
         ((p->vOutBits).nSize <= (int)uVar10)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                      ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
      }
      pwVar3 = (p->vOutBits).pArray;
      iVar15 = p->nIns;
      uVar1 = uVar13;
      if (0 < iVar15) {
        pwVar4 = (p->vInBits).pArray;
        uVar1 = iVar15 + uVar13;
        bVar16 = 0;
        uVar17 = 0;
        do {
          if (((int)uVar13 < 0) || (vLits->nSize <= (int)(uVar13 + (int)uVar17))) goto LAB_003fa31a;
          uVar11 = uVar17 >> 5 & 0x7ffffff;
          pwVar4[lVar14 + uVar11] =
               (ulong)(uint)(int)vLits->pArray[uVar17 + uVar13] << (bVar16 & 0x3e) |
               pwVar4[lVar14 + uVar11];
          uVar17 = uVar17 + 1;
          bVar16 = bVar16 + 2;
        } while (iVar15 != (int)uVar17);
      }
      iVar2 = p->nOuts;
      uVar6 = uVar1;
      if (0 < iVar2) {
        bVar16 = 0;
        if (iVar15 < 1) {
          iVar15 = 0;
        }
        uVar17 = 0;
        do {
          if (((int)uVar1 < 0) || (vLits->nSize <= (int)(uVar1 + (int)uVar17))) {
LAB_003fa31a:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                          ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
          }
          uVar11 = uVar17 >> 5 & 0x7ffffff;
          pwVar3[uVar10 + uVar11] =
               (ulong)(uint)(int)vLits->pArray[uVar17 + uVar1] << (bVar16 & 0x3e) |
               pwVar3[uVar10 + uVar11];
          uVar17 = uVar17 + 1;
          bVar16 = bVar16 + 2;
          uVar6 = uVar13 + iVar15 + iVar2;
        } while (iVar2 != (int)uVar17);
      }
      uVar13 = uVar6;
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar7);
  }
  if (uVar13 != vLits->nSize) {
    __assert_fail("Count == Vec_StrSize(vLits)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/pla/plaRead.c"
                  ,0xb8,"void Pla_ReadAddBody(Pla_Man_t *, Vec_Str_t *)");
  }
  return;
}

Assistant:

void Pla_ReadAddBody( Pla_Man_t * p, Vec_Str_t * vLits )
{
    word * pCubeIn, * pCubeOut; 
    int i, k, Lit, Count = 0; 
    int nCubesReal = Vec_StrSize(vLits) / (p->nIns + p->nOuts);
    assert( Vec_StrSize(vLits) % (p->nIns + p->nOuts) == 0 );
    if ( nCubesReal != Pla_ManCubeNum(p) )
    {
        printf( "Warning: Declared number of cubes (%d) differs from the actual (%d).\n", 
            Pla_ManCubeNum(p), nCubesReal );
        if ( nCubesReal < Pla_ManCubeNum(p) )
            Vec_IntShrink( &p->vCubes, nCubesReal );
        else
        {
            assert( nCubesReal > Pla_ManCubeNum(p) );
            Vec_IntFillNatural( &p->vCubes, nCubesReal );
            Vec_WrdFillExtra( &p->vInBits,  nCubesReal * p->nInWords,  0 );
            Vec_WrdFillExtra( &p->vOutBits, nCubesReal * p->nOutWords, 0 );
        }
    }
    Pla_ForEachCubeInOut( p, pCubeIn, pCubeOut, i )
    {
        Pla_CubeForEachLit( p->nIns, pCubeIn, Lit, k )
            Pla_CubeSetLit( pCubeIn, k, (Pla_Lit_t)Vec_StrEntry(vLits, Count++) );
        Pla_CubeForEachLit( p->nOuts, pCubeOut, Lit, k )
            Pla_CubeSetLit( pCubeOut, k, (Pla_Lit_t)Vec_StrEntry(vLits, Count++) );
    }
    assert( Count == Vec_StrSize(vLits) );
}